

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb2Image.c
# Opt level: O2

void Llb_ImgQuantifyReset(Vec_Ptr_t *vDdMans)

{
  DdManager *table;
  int i;
  
  i = 0;
  while( true ) {
    if (vDdMans->nSize <= i) {
      return;
    }
    table = (DdManager *)Vec_PtrEntry(vDdMans,i);
    if (table->bFunc2 == (DdNode *)0x0) break;
    Cudd_RecursiveDeref(table,table->bFunc);
    table->bFunc = table->bFunc2;
    table->bFunc2 = (DdNode *)0x0;
    i = i + 1;
  }
  __assert_fail("dd->bFunc2 != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bdd/llb/llb2Image.c"
                ,0x15a,"void Llb_ImgQuantifyReset(Vec_Ptr_t *)");
}

Assistant:

void Llb_ImgQuantifyReset( Vec_Ptr_t * vDdMans )
{
    DdManager * dd;
    int i;
    Vec_PtrForEachEntry( DdManager *, vDdMans, dd, i )
    {
        assert( dd->bFunc2 != NULL );
        Cudd_RecursiveDeref( dd, dd->bFunc );
        dd->bFunc = dd->bFunc2;
        dd->bFunc2 = NULL;
    }
}